

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::h_ISUB_M(JitCompilerX86 *this,Instruction *instr,int i)

{
  int in_EDX;
  JitCompilerX86 *in_RSI;
  JitCompilerX86 *in_RDI;
  Instruction *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  in_RDI->registerUsage
  [*(byte *)((long)&(in_RSI->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1)] = in_EDX;
  if (*(char *)((long)&(in_RSI->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + 2) ==
      *(char *)((long)&(in_RSI->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1)) {
    emit<2ul>(in_RDI,&in_stack_ffffffffffffffd8->opcode);
    emitByte(in_RDI,*(char *)((long)&(in_RSI->instructionOffsets).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + 1) * '\b' + 0x86);
    genAddressImm(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    genAddressReg(in_RSI,(Instruction *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                  SUB81((ulong)in_RDI >> 0x38,0));
    emit<2ul>(in_RDI,&in_stack_ffffffffffffffd8->opcode);
    emitByte(in_RDI,*(char *)((long)&(in_RSI->instructionOffsets).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + 1) * '\b' + '\x04');
    emitByte(in_RDI,'\x06');
  }
  return;
}

Assistant:

void JitCompilerX86::h_ISUB_M(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			genAddressReg(instr);
			emit(REX_SUB_RM);
			emitByte(0x04 + 8 * instr.dst);
			emitByte(0x06);
		}
		else {
			emit(REX_SUB_RM);
			emitByte(0x86 + 8 * instr.dst);
			genAddressImm(instr);
		}
	}